

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RandomNormalStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormalstatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x497) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x497;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
    RandomNormalStaticLayerParams::RandomNormalStaticLayerParams(this_00.randomnormalstatic_);
    (this->layer_).randomnormalstatic_ = (RandomNormalStaticLayerParams *)this_00;
  }
  return (RandomNormalStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalStaticLayerParams* NeuralNetworkLayer::mutable_randomnormalstatic() {
  if (!has_randomnormalstatic()) {
    clear_layer();
    set_has_randomnormalstatic();
    layer_.randomnormalstatic_ = new ::CoreML::Specification::RandomNormalStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalStatic)
  return layer_.randomnormalstatic_;
}